

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

int xml_print_list(lyout *out,int level,lyd_node *node,int is_list,int toplevel,int options)

{
  ly_ctx *ctx;
  int iVar1;
  int *piVar2;
  lys_module *plVar3;
  ulong uVar4;
  lyd_node *node_00;
  char *pcVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)level;
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (is_list == 0) {
    xml_print_leaf(out,level,node,toplevel,options);
  }
  else {
    if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
       (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
      uVar4 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar4 = uVar6;
      }
      ly_print(out,"%*s<%s",uVar4,"",node->schema->name);
    }
    else {
      plVar3 = lyd_node_module(node);
      uVar4 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar4 = uVar6;
      }
      ly_print(out,"%*s<%s xmlns=\"%s\"",uVar4,"",node->schema->name,plVar3->ns);
    }
    if (toplevel != 0) {
      xml_print_ns(out,node,options);
    }
    iVar1 = xml_print_attrs(out,node,options);
    if (iVar1 != 0) {
      return 1;
    }
    pcVar5 = "\n";
    if (level == 0) {
      pcVar5 = "";
    }
    if (node->child == (lyd_node *)0x0) {
      ly_print(out,"/>%s",pcVar5);
    }
    else {
      ly_print(out,">%s",pcVar5);
      node_00 = node->child;
      if (node_00 != (lyd_node *)0x0) {
        uVar4 = (ulong)(level + 1);
        if (level == 0) {
          uVar4 = uVar6;
        }
        do {
          iVar1 = xml_print_node(out,(int)uVar4,node_00,0,options);
          if (iVar1 != 0) {
            return 1;
          }
          node_00 = node_00->next;
        } while (node_00 != (lyd_node *)0x0);
      }
      uVar4 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar4 = uVar6;
      }
      ly_print(out,"%*s</%s>%s",uVar4,"",node->schema->name,pcVar5);
    }
  }
  iVar1 = *piVar2;
  if (iVar1 != 0) {
    ctx = node->schema->module->ctx;
    pcVar5 = strerror(iVar1);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar5);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int
xml_print_list(struct lyout *out, int level, const struct lyd_node *node, int is_list, int toplevel, int options)
{
    struct lyd_node *child;
    const char *ns;

    LY_PRINT_SET;

    if (is_list) {
        /* list print */
        if (toplevel || !node->parent || nscmp(node, node->parent)) {
            /* print "namespace" */
            ns = lyd_node_module(node)->ns;
            ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
        } else {
            ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
        }

        if (toplevel) {
            xml_print_ns(out, node, options);
        }
        if (xml_print_attrs(out, node, options)) {
            return EXIT_FAILURE;
        }

        if (!node->child) {
            ly_print(out, "/>%s", level ? "\n" : "");
            goto finish;
        }
        ly_print(out, ">%s", level ? "\n" : "");

        LY_TREE_FOR(node->child, child) {
            if (xml_print_node(out, level ? level + 1 : 0, child, 0, options)) {
                return EXIT_FAILURE;
            }
        }

        ly_print(out, "%*s</%s>%s", LEVEL, INDENT, node->schema->name, level ? "\n" : "");
    } else {
        /* leaf-list print */
        xml_print_leaf(out, level, node, toplevel, options);
    }

finish:
    LY_PRINT_RET(node->schema->module->ctx);
}